

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O1

CURLcode tftp_disconnect(Curl_easy *data,connectdata *conn,_Bool dead_connection)

{
  tftp_state_data *ptVar1;
  
  ptVar1 = (conn->proto).tftpc;
  if (ptVar1 != (tftp_state_data *)0x0) {
    (*Curl_cfree)((ptVar1->rpacket).data);
    (ptVar1->rpacket).data = (uchar *)0x0;
    (*Curl_cfree)((ptVar1->spacket).data);
    (ptVar1->spacket).data = (uchar *)0x0;
    (*Curl_cfree)(ptVar1);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode tftp_disconnect(struct Curl_easy *data,
                                struct connectdata *conn, bool dead_connection)
{
  struct tftp_state_data *state = conn->proto.tftpc;
  (void) data;
  (void) dead_connection;

  /* done, free dynamically allocated pkt buffers */
  if(state) {
    Curl_safefree(state->rpacket.data);
    Curl_safefree(state->spacket.data);
    free(state);
  }

  return CURLE_OK;
}